

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

bool iDynTree::dynamicsEstimationForwardVelAccKinematics
               (Model *param_1,Traversal *traversal,Vector3 *base_classicalProperAcc,
               Vector3 *base_angularVel,Vector3 *base_angularAcc,JointPosDoubleArray *jointPos,
               JointDOFsDoubleArray *jointVel,JointDOFsDoubleArray *jointAcc,LinkVelArray *linkVel,
               LinkAccArray *linkProperAcc)

{
  LinkAccArray *pLVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  long *plVar5;
  long lVar6;
  SpatialVector<iDynTree::SpatialMotionVector> *pSVar7;
  double *pdVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  VectorFixSize<3U> *in_RCX;
  VectorFixSize<3U> *in_RDX;
  long in_RSI;
  VectorFixSize<3U> *in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  LinkVelArray *in_stack_00000018;
  LinkAccArray *in_stack_00000020;
  AngularMotionVector3 angAcc;
  LinearMotionVector3 linProAcc;
  AngularMotionVector3 angVel;
  LinearMotionVector3 linVel;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  bool retValue;
  GeomVector3 local_b0;
  GeomVector3 local_98;
  GeomVector3 local_80;
  VectorFixSize<3U> local_68;
  long *local_50;
  long local_48;
  undefined8 local_40;
  uint local_38;
  byte local_31;
  undefined8 local_30;
  VectorFixSize<3U> *local_28;
  VectorFixSize<3U> *local_20;
  VectorFixSize<3U> *local_18;
  long local_10;
  
  local_31 = 1;
  local_38 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    uVar2 = local_38;
    uVar4 = iDynTree::Traversal::getNrOfVisitedLinks();
    if (uVar4 <= uVar2) break;
    local_40 = iDynTree::Traversal::getLink(local_10);
    local_48 = iDynTree::Traversal::getParentLink(local_10);
    plVar5 = (long *)iDynTree::Traversal::getParentJoint(local_10);
    uVar3 = local_30;
    pLVar1 = in_stack_00000020;
    local_50 = plVar5;
    if (local_48 == 0) {
      GeomVector3::GeomVector3((GeomVector3 *)0x547596);
      VectorFixSize<3U>::zero(&local_68);
      lVar6 = iDynTree::Link::getIndex();
      pSVar7 = (SpatialVector<iDynTree::SpatialMotionVector> *)
               iDynTree::LinkVelArray::operator()(in_stack_00000018,lVar6);
      SpatialVector<iDynTree::SpatialMotionVector>::setLinearVec3
                (pSVar7,(LinearVector3T *)&local_68);
      pdVar8 = VectorFixSize<3U>::data(local_20);
      iDynTree::GeomVector3::GeomVector3(&local_80,pdVar8,3);
      lVar6 = iDynTree::Link::getIndex();
      pSVar7 = (SpatialVector<iDynTree::SpatialMotionVector> *)
               iDynTree::LinkVelArray::operator()(in_stack_00000018,lVar6);
      SpatialVector<iDynTree::SpatialMotionVector>::setAngularVec3(pSVar7,&local_80);
      pdVar8 = VectorFixSize<3U>::data(local_18);
      iDynTree::GeomVector3::GeomVector3(&local_98,pdVar8,3);
      pLVar1 = in_stack_00000020;
      lVar6 = iDynTree::Link::getIndex();
      pSVar7 = (SpatialVector<iDynTree::SpatialMotionVector> *)
               iDynTree::LinkAccArray::operator()(pLVar1,lVar6);
      SpatialVector<iDynTree::SpatialMotionVector>::setLinearVec3(pSVar7,&local_98);
      pdVar8 = VectorFixSize<3U>::data(local_28);
      iDynTree::GeomVector3::GeomVector3(&local_b0,pdVar8,3);
      pLVar1 = in_stack_00000020;
      lVar6 = iDynTree::Link::getIndex();
      pSVar7 = (SpatialVector<iDynTree::SpatialMotionVector> *)
               iDynTree::LinkAccArray::operator()(pLVar1,lVar6);
      SpatialVector<iDynTree::SpatialMotionVector>::setAngularVec3(pSVar7,&local_b0);
    }
    else {
      uVar9 = iDynTree::Link::getIndex();
      uVar10 = iDynTree::Link::getIndex();
      (**(code **)(*plVar5 + 0x70))
                (plVar5,uVar3,in_stack_00000008,in_stack_00000010,in_stack_00000018,pLVar1,uVar9,
                 uVar10);
    }
    local_38 = local_38 + 1;
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool dynamicsEstimationForwardVelAccKinematics(const iDynTree::Model & /*model*/,
                                               const iDynTree::Traversal & traversal,
                                               const Vector3 & base_classicalProperAcc,
                                               const Vector3 & base_angularVel,
                                               const Vector3 & base_angularAcc,
                                               const iDynTree::JointPosDoubleArray & jointPos,
                                               const iDynTree::JointDOFsDoubleArray & jointVel,
                                               const iDynTree::JointDOFsDoubleArray & jointAcc,
                                                     iDynTree::LinkVelArray & linkVel,
                                                     iDynTree::LinkAccArray  & linkProperAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, we can set the base velocity and proper acceleration
            // from the input base information

            // the dynamics is invariant to a linear velocity offset, so we can put an arbitrary
            // value for the linear part of the twist: we choose to set it to zero for convenience,
            // but please note that this **does not** mean that we are assuming that the body
            // has a zero velocity with respect to a earth-fixed frame
            LinearMotionVector3 linVel;
            linVel.zero();
            linkVel(visitedLink->getIndex()).setLinearVec3(linVel);

            // We have the input angular velocity
            AngularMotionVector3 angVel(base_angularVel.data(),3);
            linkVel(visitedLink->getIndex()).setAngularVec3(angVel);

            // We don't need to convert the proper classical acceleration
            // in spatial classical acceleration because the difference between
            // the two depends linearly on the linear part of the link velocity,
            // that we choose to be zero
            LinearMotionVector3 linProAcc(base_classicalProperAcc.data(),3);
            linkProperAcc(visitedLink->getIndex()).setLinearVec3(linProAcc);
            AngularMotionVector3 angAcc(base_angularAcc.data(),3);
            linkProperAcc(visitedLink->getIndex()).setAngularVec3(angAcc);
        }
        else
        {
            // Otherwise we compute the child velocity and acceleration from parent
            toParentJoint->computeChildVelAcc(jointPos,
                                              jointVel,
                                              jointAcc,
                                              linkVel,
                                              linkProperAcc,
                                              visitedLink->getIndex(),parentLink->getIndex());
        }

    }

    return retValue;

}